

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

uint Catch::rngSeed(void)

{
  int iVar1;
  uint uVar2;
  IContext *pIVar3;
  undefined4 extraout_var;
  
  pIVar3 = getCurrentContext();
  iVar1 = (*pIVar3->_vptr_IContext[4])();
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x88))();
  return uVar2;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }